

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::yypush_(parser_t *this,char *m,stack_symbol_type *sym)

{
  ostream *poVar1;
  stack_symbol_type *sym_local;
  char *m_local;
  parser_t *this_local;
  
  if ((m != (char *)0x0) && (this->yydebug_ != 0)) {
    poVar1 = std::operator<<(this->yycdebug_,m);
    std::operator<<(poVar1,' ');
    yy_print_<tchecker::parsing::system::parser_t::by_state>
              (this,this->yycdebug_,
               &sym->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>);
    std::operator<<(this->yycdebug_,'\n');
  }
  stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
  ::push(&this->yystack_,sym);
  return;
}

Assistant:

void
  parser_t::yypush_ (const char* m, YY_MOVE_REF (stack_symbol_type) sym)
  {
    if (m)
      YY_SYMBOL_PRINT (m, sym);
    yystack_.push (YY_MOVE (sym));
  }